

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  Gia_Obj_t *pGVar1;
  size_t __size;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  
  if (((ulong)pObj & 1) == 0) {
    bVar8 = fFirst == 0;
    pGVar7 = pObj;
    do {
      while( true ) {
        uVar5 = (uint)*(ulong *)pObj;
        if (((~uVar5 & 0x9fffffff) == 0) || ((bVar8 && (1 < (int)pObj->Value)))) goto LAB_005d7057;
        if (fUseMuxes == 0) break;
        iVar2 = Gia_ObjIsMuxType(pObj);
        if (iVar2 != 0) goto LAB_005d7057;
        Cec_CollectSuper_rec
                  ((Gia_Obj_t *)
                   ((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) |
                   (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))),vSuper,0,fUseMuxes);
        pGVar1 = pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff);
        uVar6 = (ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1);
        pObj = (Gia_Obj_t *)(uVar6 | (ulong)pGVar1);
        bVar8 = true;
        if (uVar6 != 0 || ((ulong)pGVar1 & 1) != 0) goto LAB_005d7057;
      }
      fUseMuxes = 0;
      Cec_CollectSuper_rec
                ((Gia_Obj_t *)
                 ((ulong)(uVar5 >> 0x1d & 1) | (ulong)(pGVar7 + -(*(ulong *)pObj & 0x1fffffff))),
                 vSuper,0,0);
      pGVar1 = pGVar7 + -(*(ulong *)pGVar7 >> 0x20 & 0x1fffffff);
      uVar6 = (ulong)((uint)(*(ulong *)pGVar7 >> 0x3d) & 1);
      pObj = (Gia_Obj_t *)(uVar6 | (ulong)pGVar1);
      bVar8 = true;
      pGVar7 = pObj;
    } while (uVar6 == 0 && ((ulong)pGVar1 & 1) == 0);
  }
LAB_005d7057:
  iVar2 = vSuper->nSize;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      if ((Gia_Obj_t *)vSuper->pArray[lVar4] == pObj) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  if (iVar2 == vSuper->nCap) {
    if (iVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar2 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = iVar2 * 2;
    }
  }
  else {
    ppvVar3 = vSuper->pArray;
  }
  iVar2 = vSuper->nSize;
  vSuper->nSize = iVar2 + 1;
  ppvVar3[iVar2] = pObj;
  return;
}

Assistant:

void Cec_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && Gia_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}